

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O3

SourceLocation __thiscall
slang::getMatchingMacroLoc
          (slang *this,SourceManager *sm,SourceLocation loc,SourceLocation contextLoc,bool isStart,
          span<const_slang::BufferID,_18446744073709551615UL> commonArgs)

{
  uint *puVar1;
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_00;
  bool bVar2;
  uint uVar3;
  uint *puVar4;
  SourceLocation SVar5;
  ulong uVar6;
  uint uVar7;
  undefined7 in_register_00000081;
  uint *puVar8;
  ulong in_R9;
  ulong uVar9;
  SourceRange SVar10;
  SourceRange SVar11;
  undefined4 in_stack_ffffffffffffffa8;
  
  puVar8 = (uint *)CONCAT71(in_register_00000081,isStart);
  uVar3 = loc._0_4_ & 0xfffffff;
  uVar7 = (uint)sm & 0xfffffff;
  if (uVar7 != uVar3) {
    puVar1 = puVar8 + in_R9;
    do {
      bVar2 = SourceManager::isMacroLoc((SourceManager *)this,(SourceLocation)sm);
      if (!bVar2) {
        return (SourceLocation)0x0;
      }
      bVar2 = SourceManager::isMacroArgLoc((SourceManager *)this,(SourceLocation)sm);
      if (bVar2) {
        puVar4 = puVar8;
        uVar9 = in_R9;
        if (0 < (long)in_R9) {
          do {
            uVar6 = uVar9 >> 1;
            if (puVar4[uVar6] < uVar7) {
              puVar4 = puVar4 + uVar6 + 1;
              uVar6 = ~uVar6 + uVar9;
            }
            uVar9 = uVar6;
          } while (0 < (long)uVar6);
        }
        if ((puVar4 == puVar1) || (uVar7 < *puVar4)) {
          SVar5 = (SourceLocation)0x0;
        }
        else {
          SVar5 = SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
        }
        SVar10.endLoc = SVar5;
        SVar10.startLoc = SVar5;
        SVar11 = SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
      }
      else {
        SVar10 = SourceManager::getExpansionRange((SourceManager *)this,(SourceLocation)sm);
        SVar5 = SourceManager::getOriginalLoc((SourceManager *)this,(SourceLocation)sm);
        SVar11.endLoc = SVar5;
        SVar11.startLoc = SVar5;
      }
      SVar5 = SVar10.endLoc;
      if (contextLoc._0_1_ != '\0') {
        SVar5 = SVar10.startLoc;
      }
      if ((((ulong)SVar5 & 0xfffffff) != 0) &&
         (commonArgs_00.data_._4_4_ = uVar3, commonArgs_00.data_._0_4_ = in_stack_ffffffffffffffa8,
         commonArgs_00.size_ = (size_type)puVar8,
         SVar5 = getMatchingMacroLoc(this,(SourceManager *)SVar5,loc,
                                     (SourceLocation)((ulong)contextLoc & 0xff),SUB81(puVar8,0),
                                     commonArgs_00), ((ulong)SVar5 & 0xfffffff) != 0)) {
        return SVar5;
      }
      sm = (SourceManager *)SVar11.endLoc;
      if (contextLoc._0_1_ != '\0') {
        sm = (SourceManager *)SVar11.startLoc;
      }
      uVar7 = (uint)sm & 0xfffffff;
    } while (uVar7 != uVar3);
  }
  return (SourceLocation)sm;
}

Assistant:

static SourceLocation getMatchingMacroLoc(const SourceManager& sm, SourceLocation loc,
                                          SourceLocation contextLoc, bool isStart,
                                          span<const BufferID> commonArgs) {
    if (loc.buffer() == contextLoc.buffer())
        return loc;

    if (!sm.isMacroLoc(loc))
        return {};

    SourceRange macroRange;
    SourceRange macroArgRange;
    if (sm.isMacroArgLoc(loc)) {
        // Only look at the original location of this argument if the other location
        // in the range is also present in the expansion.
        if (std::binary_search(commonArgs.begin(), commonArgs.end(), loc.buffer())) {
            SourceLocation orig = sm.getOriginalLoc(loc);
            macroRange = SourceRange(orig, orig);
        }
        macroArgRange = sm.getExpansionRange(loc);
    }
    else {
        macroRange = sm.getExpansionRange(loc);

        SourceLocation orig = sm.getOriginalLoc(loc);
        macroArgRange = SourceRange(orig, orig);
    }

    SourceLocation macroLoc = isStart ? macroRange.start() : macroRange.end();
    if (macroLoc) {
        macroLoc = getMatchingMacroLoc(sm, macroLoc, contextLoc, isStart, commonArgs);
        if (macroLoc)
            return macroLoc;
    }

    SourceLocation argLoc = isStart ? macroArgRange.start() : macroArgRange.end();
    return getMatchingMacroLoc(sm, argLoc, contextLoc, isStart, commonArgs);
}